

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::piece_passed(torrent *this,piece_index_t index)

{
  torrent_peer *ptVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  session_settings *this_00;
  reference pptVar5;
  pointer this_01;
  peer_connection_interface *local_c8;
  peer_connection *peer;
  int trust_points;
  torrent_peer *p;
  iterator __end2;
  iterator __begin2;
  set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  *__range2;
  piece_index_t *local_58;
  undefined1 local_50 [8];
  set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  peers;
  torrent *this_local;
  piece_index_t index_local;
  
  this_local._4_4_ = index.m_val;
  uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar3 & 1) != 0) {
    uVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"PIECE_PASSED (%d)",(ulong)uVar3);
  }
  peers._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = '\x10';
  set_need_save_resume(this,(resume_data_flags_t)0x10);
  inc_stats_counter(this,0x6b,1);
  this_00 = settings(this);
  iVar4 = session_settings::get_int(this_00,0x4019);
  if (iVar4 == 1) {
    peers._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = this_local._4_4_;
    add_suggest_piece(this,this_local._4_4_);
  }
  local_58 = (piece_index_t *)((long)&this_local + 4);
  __range2 = (set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)this;
  piece_passed::anon_class_16_2_f7f469bf::operator()
            ((set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)local_50,(anon_class_16_2_f7f469bf *)&__range2);
  __end2 = ::std::
           set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ::begin((set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)local_50);
  p = (torrent_peer *)
      ::std::
      set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ::end((set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)local_50);
  while (bVar2 = ::std::operator!=(&__end2,(_Self *)&p), bVar2) {
    pptVar5 = ::std::_Rb_tree_const_iterator<libtorrent::aux::torrent_peer_*>::operator*(&__end2);
    ptVar1 = *pptVar5;
    if (ptVar1 != (torrent_peer *)0x0) {
      *(uint *)&ptVar1->field_0x1b = *(uint *)&ptVar1->field_0x1b & 0xfbffffff;
      peer._4_4_ = ((*(int *)&ptVar1->field_0x1b << 0xf) >> 0x1c) + 1;
      if (8 < (int)peer._4_4_) {
        peer._4_4_ = 8;
      }
      *(uint *)&ptVar1->field_0x1b =
           *(uint *)&ptVar1->field_0x1b & 0xfffe1fff | (peer._4_4_ & 0xf) << 0xd;
      if (ptVar1->connection != (peer_connection_interface *)0x0) {
        if (ptVar1->connection == (peer_connection_interface *)0x0) {
          local_c8 = (peer_connection_interface *)0x0;
        }
        else {
          local_c8 = ptVar1->connection + -0x10;
        }
        (*local_c8->_vptr_peer_connection_interface[0x15])(local_c8,(ulong)(uint)this_local._4_4_);
      }
    }
    ::std::_Rb_tree_const_iterator<libtorrent::aux::torrent_peer_*>::operator++(&__end2);
  }
  this_01 = ::std::
            unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ::operator->(&(this->super_torrent_hot_members).m_picker);
  piece_picker::piece_passed(this_01,this_local._4_4_);
  update_gauge(this);
  we_have(this,this_local._4_4_,false);
  remove_time_critical_piece(this,this_local._4_4_,true);
  ::std::
  set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ::~set((set<libtorrent::aux::torrent_peer_*,_std::less<libtorrent::aux::torrent_peer_*>,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          *)local_50);
  return;
}

Assistant:

void torrent::piece_passed(piece_index_t const index)
	{
//		INVARIANT_CHECK;
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!m_picker->has_piece_passed(index));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("PIECE_PASSED (%d)", int(index));
#endif

//		std::fprintf(stderr, "torrent::piece_passed piece:%d\n", index);

		TORRENT_ASSERT(index >= piece_index_t(0));
		TORRENT_ASSERT(index < m_torrent_file->end_piece());

		set_need_save_resume(torrent_handle::if_download_progress);

		inc_stats_counter(counters::num_piece_passed);

		if (settings().get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache)
		{
			// we just got a new piece. Chances are that it's actually the
			// rarest piece (since we're likely to download pieces rarest first)
			// if it's rarer than any other piece that we currently suggest, insert
			// it in the suggest set and pop the last one out
			add_suggest_piece(index);
		}

		// increase the trust point of all peers that sent
		// parts of this piece.
		std::set<torrent_peer*> const peers = [&]
		{
			std::vector<torrent_peer*> const downloaders = m_picker->get_downloaders(index);

			std::set<torrent_peer*> ret;
			// these torrent_peer pointers are owned by m_peer_list and they may be
			// invalidated if a peer disconnects. We cannot keep them across any
			// significant operations, but we should use them right away
			// ignore nullptrs
			std::remove_copy(downloaders.begin(), downloaders.end()
				, std::inserter(ret, ret.begin()), static_cast<torrent_peer*>(nullptr));
			return ret;
		}();

		for (auto* p : peers)
		{
			TORRENT_ASSERT(p != nullptr);
			if (p == nullptr) continue;
			TORRENT_ASSERT(p->in_use);
			p->on_parole = false;
			int trust_points = p->trust_points;
			++trust_points;
			if (trust_points > 8) trust_points = 8;
			p->trust_points = trust_points;
			if (p->connection)
			{
				auto* peer = static_cast<peer_connection*>(p->connection);
				TORRENT_ASSERT(peer->m_in_use == 1337);
				peer->received_valid_data(index);
			}
		}

		m_picker->piece_passed(index);
		update_gauge();
		we_have(index);

#ifndef TORRENT_DISABLE_STREAMING
		remove_time_critical_piece(index, true);
#endif
	}